

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O2

void __thiscall QLabel::changeEvent(QLabel *this,QEvent *ev)

{
  short sVar1;
  QLabelPrivate *this_00;
  QWidgetTextControl *this_01;
  QTextDocument *pQVar2;
  QPalette *pal;
  
  this_00 = *(QLabelPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  sVar1 = *(short *)(ev + 8);
  if (sVar1 == 0x24) {
LAB_003e5b03:
    if ((this_00->field_0x340 & 0x10) == 0) goto LAB_003e5b57;
    if ((QWidgetTextControl *)this_00->control != (QWidgetTextControl *)0x0) {
      pQVar2 = QWidgetTextControl::document((QWidgetTextControl *)this_00->control);
      QTextDocument::setDefaultFont((QFont *)pQVar2);
    }
  }
  else {
    if (sVar1 == 0x27) {
      this_01 = (QWidgetTextControl *)this_00->control;
      if (this_01 != (QWidgetTextControl *)0x0) {
        pal = QWidget::palette((QWidget *)this);
        QWidgetTextControl::setPalette(this_01,pal);
      }
      goto LAB_003e5b57;
    }
    if (sVar1 != 0xb2) {
      if (sVar1 != 0x61) goto LAB_003e5b57;
      goto LAB_003e5b03;
    }
  }
  QLabelPrivate::updateLabel(this_00);
LAB_003e5b57:
  QFrame::changeEvent(&this->super_QFrame,ev);
  return;
}

Assistant:

void QLabel::changeEvent(QEvent *ev)
{
    Q_D(QLabel);
    if (ev->type() == QEvent::FontChange || ev->type() == QEvent::ApplicationFontChange) {
        if (d->isTextLabel) {
            if (d->control)
                d->control->document()->setDefaultFont(font());
            d->updateLabel();
        }
    } else if (ev->type() == QEvent::PaletteChange && d->control) {
        d->control->setPalette(palette());
    } else if (ev->type() == QEvent::ContentsRectChange) {
        d->updateLabel();
    }
    QFrame::changeEvent(ev);
}